

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O3

int scanner_block_cmp_fn(ScannerBlock *a,ScannerBlock *b,hash_fns_t *fns)

{
  ScanState *pSVar1;
  ScanState *pSVar2;
  void *pvVar3;
  
  if (0 < (long)fns->data[0]) {
    pvVar3 = (void *)0x0;
    do {
      pSVar1 = a->chars[(long)pvVar3];
      pSVar2 = b->chars[(long)pvVar3];
      if (pSVar1 != pSVar2) {
        if (pSVar1 == (ScanState *)0x0) {
          return 1;
        }
        if (pSVar2 == (ScanState *)0x0) {
          return 1;
        }
        if (pSVar1->index != pSVar2->index) {
          return 1;
        }
      }
      pvVar3 = (void *)((long)pvVar3 + 1);
    } while (fns->data[0] != pvVar3);
  }
  return 0;
}

Assistant:

static int scanner_block_cmp_fn(ScannerBlock *a, ScannerBlock *b, hash_fns_t *fns) {
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sa = a->chars;
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    if (sa[i] == sb[i]) continue;
    if (!sa[i] || !sb[i]) return 1;
    if (sa[i]->index != sb[i]->index) return 1;
  }
  return 0;
}